

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySubImage3D::texSubImage3D
          (TextureCubeMapArraySubImage3D *this,SubImage3DCopyParams *copy_params,
          GLuint *data_pointer)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x13c0))
            (0x9009,0,copy_params->m_xoffset,copy_params->m_yoffset,copy_params->m_zoffset,
             copy_params->m_width,copy_params->m_height,copy_params->m_depth,0x8d99,0x1405,
             data_pointer);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"Error filling texture object\'s data store with data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                  ,0x194);
  return;
}

Assistant:

void TextureCubeMapArraySubImage3D::texSubImage3D(const SubImage3DCopyParams& copy_params,
												  const glw::GLuint*		  data_pointer)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.texSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, copy_params.m_xoffset, copy_params.m_yoffset, copy_params.m_zoffset,
					 copy_params.m_width, copy_params.m_height, copy_params.m_depth, GL_RGBA_INTEGER, GL_UNSIGNED_INT,
					 data_pointer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture object's data store with data");
}